

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

Bigint * lshift(Bigint *b,int k)

{
  sbyte sVar1;
  int iVar2;
  Bigint *pBVar3;
  long lVar4;
  ULong *pUVar5;
  int iVar6;
  ULong *__s;
  uint uVar7;
  int iVar8;
  
  uVar7 = k >> 5;
  iVar6 = b->k;
  iVar8 = b->wds + uVar7;
  for (iVar2 = b->maxwds; iVar2 <= iVar8; iVar2 = iVar2 * 2) {
    iVar6 = iVar6 + 1;
  }
  pBVar3 = Balloc(iVar6);
  __s = pBVar3->x;
  if (0 < (int)uVar7) {
    memset(__s,0,(ulong)uVar7 << 2);
    __s = pBVar3->x + (ulong)(uVar7 - 1) + 1;
  }
  pUVar5 = b->x;
  iVar6 = b->wds;
  if ((k & 0x1fU) == 0) {
    do {
      uVar7 = *pUVar5;
      pUVar5 = pUVar5 + 1;
      *__s = uVar7;
      __s = __s + 1;
    } while (pUVar5 < b->x + iVar6);
  }
  else {
    sVar1 = (sbyte)(k & 0x1fU);
    uVar7 = 0;
    do {
      *__s = *pUVar5 << sVar1 | uVar7;
      __s = __s + 1;
      uVar7 = *pUVar5;
      pUVar5 = pUVar5 + 1;
      uVar7 = uVar7 >> (0x20U - sVar1 & 0x1f);
    } while (pUVar5 < b->x + iVar6);
    *__s = uVar7;
    iVar8 = (iVar8 + 1) - (uint)(uVar7 == 0);
  }
  pBVar3->wds = iVar8;
  if (b != (Bigint *)0x0) {
    lVar4 = (long)b->k;
    if (lVar4 < 8) {
      b->next = TI0.Freelist[lVar4];
      TI0.Freelist[lVar4] = b;
    }
    else {
      free(b);
    }
  }
  return pBVar3;
}

Assistant:

static Bigint *
lshift(Bigint *b, int k MTd)
{
	int i, k1, n, n1;
	Bigint *b1;
	ULong *x, *x1, *xe, z;

#ifdef Pack_32
	n = k >> 5;
#else
	n = k >> 4;
#endif
	k1 = b->k;
	n1 = n + b->wds + 1;
	for(i = b->maxwds; n1 > i; i <<= 1)
		k1++;
	b1 = Balloc(k1 MTa);
	x1 = b1->x;
	for(i = 0; i < n; i++)
		*x1++ = 0;
	x = b->x;
	xe = x + b->wds;
#ifdef Pack_32
	if (k &= 0x1f) {
		k1 = 32 - k;
		z = 0;
		do {
			*x1++ = *x << k | z;
			z = *x++ >> k1;
			}
			while(x < xe);
		if ((*x1 = z))
			++n1;
		}
#else
	if (k &= 0xf) {
		k1 = 16 - k;
		z = 0;
		do {
			*x1++ = *x << k  & 0xffff | z;
			z = *x++ >> k1;
			}
			while(x < xe);
		if (*x1 = z)
			++n1;
		}
#endif
	else do
		*x1++ = *x++;
		while(x < xe);
	b1->wds = n1 - 1;
	Bfree(b MTa);
	return b1;
	}